

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SerialAnalyzerSettings.cpp
# Opt level: O2

void __thiscall SerialAnalyzerSettings::SerialAnalyzerSettings(SerialAnalyzerSettings *this)

{
  Channel *this_00;
  unique_ptr<AnalyzerSettingInterfaceChannel,_std::default_delete<AnalyzerSettingInterfaceChannel>_>
  *puVar1;
  unique_ptr<AnalyzerSettingInterfaceInteger,_std::default_delete<AnalyzerSettingInterfaceInteger>_>
  *puVar2;
  unique_ptr<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
  *puVar3;
  unique_ptr<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
  *puVar4;
  unique_ptr<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
  *puVar5;
  unique_ptr<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
  *puVar6;
  unique_ptr<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
  *puVar7;
  unique_ptr<AnalyzerSettingInterfaceBool,_std::default_delete<AnalyzerSettingInterfaceBool>_>
  *puVar8;
  unique_ptr<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
  *puVar9;
  AnalyzerSettingInterfaceChannel *pAVar10;
  AnalyzerSettingInterfaceInteger *pAVar11;
  AnalyzerSettingInterfaceBool *pAVar12;
  AnalyzerSettingInterfaceNumberList *pAVar13;
  AnalyzerSettingInterfaceChannel *this_01;
  AnalyzerSettingInterfaceInteger *this_02;
  AnalyzerSettingInterfaceBool *this_03;
  AnalyzerSettingInterfaceNumberList *pAVar14;
  ostream *poVar15;
  Channel *pCVar16;
  ulong uVar17;
  char *pcVar18;
  uint uVar19;
  int iVar20;
  long lVar21;
  char *local_1d8 [4];
  stringstream ss;
  ostream local_1a8 [376];
  
  AnalyzerSettings::AnalyzerSettings(&this->super_AnalyzerSettings);
  *(undefined ***)this = &PTR__SerialAnalyzerSettings_0010bd70;
  this_00 = &this->mInputChannel;
  uVar17 = 0xffffffffffffffff;
  Channel::Channel(this_00,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
  this->mBitRate = 0x2580;
  this->mBitsPerTransfer = 8;
  this->mShiftOrder = LsbFirst;
  this->mStopBits = 1.0;
  this->mParity = None;
  this->mInverted = false;
  this->mUseAutobaud = false;
  this->mSerialMode = Normal;
  puVar1 = &this->mInputChannelInterface;
  puVar2 = &this->mBitRateInterface;
  puVar3 = &this->mBitsPerTransferInterface;
  puVar4 = &this->mShiftOrderInterface;
  puVar5 = &this->mStopBitsInterface;
  puVar6 = &this->mParityInterface;
  puVar7 = &this->mInvertedInterface;
  puVar8 = &this->mUseAutobaudInterface;
  puVar9 = &this->mSerialModeInterface;
  (this->mInputChannelInterface)._M_t.
  super___uniq_ptr_impl<AnalyzerSettingInterfaceChannel,_std::default_delete<AnalyzerSettingInterfaceChannel>_>
  ._M_t.
  super__Tuple_impl<0UL,_AnalyzerSettingInterfaceChannel_*,_std::default_delete<AnalyzerSettingInterfaceChannel>_>
  .super__Head_base<0UL,_AnalyzerSettingInterfaceChannel_*,_false>._M_head_impl =
       (AnalyzerSettingInterfaceChannel *)0x0;
  (this->mBitRateInterface)._M_t.
  super___uniq_ptr_impl<AnalyzerSettingInterfaceInteger,_std::default_delete<AnalyzerSettingInterfaceInteger>_>
  ._M_t.
  super__Tuple_impl<0UL,_AnalyzerSettingInterfaceInteger_*,_std::default_delete<AnalyzerSettingInterfaceInteger>_>
  .super__Head_base<0UL,_AnalyzerSettingInterfaceInteger_*,_false>._M_head_impl =
       (AnalyzerSettingInterfaceInteger *)0x0;
  (this->mBitsPerTransferInterface)._M_t.
  super___uniq_ptr_impl<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
  ._M_t.
  super__Tuple_impl<0UL,_AnalyzerSettingInterfaceNumberList_*,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
  .super__Head_base<0UL,_AnalyzerSettingInterfaceNumberList_*,_false>._M_head_impl =
       (AnalyzerSettingInterfaceNumberList *)0x0;
  (this->mShiftOrderInterface)._M_t.
  super___uniq_ptr_impl<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
  ._M_t.
  super__Tuple_impl<0UL,_AnalyzerSettingInterfaceNumberList_*,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
  .super__Head_base<0UL,_AnalyzerSettingInterfaceNumberList_*,_false>._M_head_impl =
       (AnalyzerSettingInterfaceNumberList *)0x0;
  (this->mStopBitsInterface)._M_t.
  super___uniq_ptr_impl<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
  ._M_t.
  super__Tuple_impl<0UL,_AnalyzerSettingInterfaceNumberList_*,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
  .super__Head_base<0UL,_AnalyzerSettingInterfaceNumberList_*,_false>._M_head_impl =
       (AnalyzerSettingInterfaceNumberList *)0x0;
  (this->mParityInterface)._M_t.
  super___uniq_ptr_impl<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
  ._M_t.
  super__Tuple_impl<0UL,_AnalyzerSettingInterfaceNumberList_*,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
  .super__Head_base<0UL,_AnalyzerSettingInterfaceNumberList_*,_false>._M_head_impl =
       (AnalyzerSettingInterfaceNumberList *)0x0;
  (this->mInvertedInterface)._M_t.
  super___uniq_ptr_impl<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
  ._M_t.
  super__Tuple_impl<0UL,_AnalyzerSettingInterfaceNumberList_*,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
  .super__Head_base<0UL,_AnalyzerSettingInterfaceNumberList_*,_false>._M_head_impl =
       (AnalyzerSettingInterfaceNumberList *)0x0;
  (this->mUseAutobaudInterface)._M_t.
  super___uniq_ptr_impl<AnalyzerSettingInterfaceBool,_std::default_delete<AnalyzerSettingInterfaceBool>_>
  ._M_t.
  super__Tuple_impl<0UL,_AnalyzerSettingInterfaceBool_*,_std::default_delete<AnalyzerSettingInterfaceBool>_>
  .super__Head_base<0UL,_AnalyzerSettingInterfaceBool_*,_false>._M_head_impl =
       (AnalyzerSettingInterfaceBool *)0x0;
  (this->mSerialModeInterface)._M_t.
  super___uniq_ptr_impl<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
  ._M_t.
  super__Tuple_impl<0UL,_AnalyzerSettingInterfaceNumberList_*,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
  .super__Head_base<0UL,_AnalyzerSettingInterfaceNumberList_*,_false>._M_head_impl =
       (AnalyzerSettingInterfaceNumberList *)0x0;
  this_01 = (AnalyzerSettingInterfaceChannel *)
            AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,uVar17);
  AnalyzerSettingInterfaceChannel::AnalyzerSettingInterfaceChannel(this_01);
  pAVar10 = (puVar1->_M_t).
            super___uniq_ptr_impl<AnalyzerSettingInterfaceChannel,_std::default_delete<AnalyzerSettingInterfaceChannel>_>
            ._M_t.
            super__Tuple_impl<0UL,_AnalyzerSettingInterfaceChannel_*,_std::default_delete<AnalyzerSettingInterfaceChannel>_>
            .super__Head_base<0UL,_AnalyzerSettingInterfaceChannel_*,_false>._M_head_impl;
  (puVar1->_M_t).
  super___uniq_ptr_impl<AnalyzerSettingInterfaceChannel,_std::default_delete<AnalyzerSettingInterfaceChannel>_>
  ._M_t.
  super__Tuple_impl<0UL,_AnalyzerSettingInterfaceChannel_*,_std::default_delete<AnalyzerSettingInterfaceChannel>_>
  .super__Head_base<0UL,_AnalyzerSettingInterfaceChannel_*,_false>._M_head_impl = this_01;
  if (pAVar10 != (AnalyzerSettingInterfaceChannel *)0x0) {
    (**(code **)(*(long *)pAVar10 + 8))();
    this_01 = (puVar1->_M_t).
              super___uniq_ptr_impl<AnalyzerSettingInterfaceChannel,_std::default_delete<AnalyzerSettingInterfaceChannel>_>
              ._M_t.
              super__Tuple_impl<0UL,_AnalyzerSettingInterfaceChannel_*,_std::default_delete<AnalyzerSettingInterfaceChannel>_>
              .super__Head_base<0UL,_AnalyzerSettingInterfaceChannel_*,_false>._M_head_impl;
  }
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)this_01,"Input Channel");
  pCVar16 = this_00;
  AnalyzerSettingInterfaceChannel::SetChannel
            ((Channel *)
             (puVar1->_M_t).
             super___uniq_ptr_impl<AnalyzerSettingInterfaceChannel,_std::default_delete<AnalyzerSettingInterfaceChannel>_>
             ._M_t.
             super__Tuple_impl<0UL,_AnalyzerSettingInterfaceChannel_*,_std::default_delete<AnalyzerSettingInterfaceChannel>_>
             .super__Head_base<0UL,_AnalyzerSettingInterfaceChannel_*,_false>._M_head_impl);
  this_02 = (AnalyzerSettingInterfaceInteger *)
            AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,(ulong)pCVar16);
  AnalyzerSettingInterfaceInteger::AnalyzerSettingInterfaceInteger(this_02);
  pAVar11 = (puVar2->_M_t).
            super___uniq_ptr_impl<AnalyzerSettingInterfaceInteger,_std::default_delete<AnalyzerSettingInterfaceInteger>_>
            ._M_t.
            super__Tuple_impl<0UL,_AnalyzerSettingInterfaceInteger_*,_std::default_delete<AnalyzerSettingInterfaceInteger>_>
            .super__Head_base<0UL,_AnalyzerSettingInterfaceInteger_*,_false>._M_head_impl;
  (puVar2->_M_t).
  super___uniq_ptr_impl<AnalyzerSettingInterfaceInteger,_std::default_delete<AnalyzerSettingInterfaceInteger>_>
  ._M_t.
  super__Tuple_impl<0UL,_AnalyzerSettingInterfaceInteger_*,_std::default_delete<AnalyzerSettingInterfaceInteger>_>
  .super__Head_base<0UL,_AnalyzerSettingInterfaceInteger_*,_false>._M_head_impl = this_02;
  if (pAVar11 != (AnalyzerSettingInterfaceInteger *)0x0) {
    (**(code **)(*(long *)pAVar11 + 8))();
    this_02 = (puVar2->_M_t).
              super___uniq_ptr_impl<AnalyzerSettingInterfaceInteger,_std::default_delete<AnalyzerSettingInterfaceInteger>_>
              ._M_t.
              super__Tuple_impl<0UL,_AnalyzerSettingInterfaceInteger_*,_std::default_delete<AnalyzerSettingInterfaceInteger>_>
              .super__Head_base<0UL,_AnalyzerSettingInterfaceInteger_*,_false>._M_head_impl;
  }
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)this_02,"Bit Rate (Bits/s)");
  AnalyzerSettingInterfaceInteger::SetMax
            ((int)(puVar2->_M_t).
                  super___uniq_ptr_impl<AnalyzerSettingInterfaceInteger,_std::default_delete<AnalyzerSettingInterfaceInteger>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_AnalyzerSettingInterfaceInteger_*,_std::default_delete<AnalyzerSettingInterfaceInteger>_>
                  .super__Head_base<0UL,_AnalyzerSettingInterfaceInteger_*,_false>._M_head_impl);
  AnalyzerSettingInterfaceInteger::SetMin
            ((int)(puVar2->_M_t).
                  super___uniq_ptr_impl<AnalyzerSettingInterfaceInteger,_std::default_delete<AnalyzerSettingInterfaceInteger>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_AnalyzerSettingInterfaceInteger_*,_std::default_delete<AnalyzerSettingInterfaceInteger>_>
                  .super__Head_base<0UL,_AnalyzerSettingInterfaceInteger_*,_false>._M_head_impl);
  uVar17 = (ulong)this->mBitRate;
  AnalyzerSettingInterfaceInteger::SetInteger
            ((int)(this->mBitRateInterface)._M_t.
                  super___uniq_ptr_impl<AnalyzerSettingInterfaceInteger,_std::default_delete<AnalyzerSettingInterfaceInteger>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_AnalyzerSettingInterfaceInteger_*,_std::default_delete<AnalyzerSettingInterfaceInteger>_>
                  .super__Head_base<0UL,_AnalyzerSettingInterfaceInteger_*,_false>._M_head_impl);
  this_03 = (AnalyzerSettingInterfaceBool *)
            AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,uVar17);
  AnalyzerSettingInterfaceBool::AnalyzerSettingInterfaceBool(this_03);
  pAVar12 = (puVar8->_M_t).
            super___uniq_ptr_impl<AnalyzerSettingInterfaceBool,_std::default_delete<AnalyzerSettingInterfaceBool>_>
            ._M_t.
            super__Tuple_impl<0UL,_AnalyzerSettingInterfaceBool_*,_std::default_delete<AnalyzerSettingInterfaceBool>_>
            .super__Head_base<0UL,_AnalyzerSettingInterfaceBool_*,_false>._M_head_impl;
  (puVar8->_M_t).
  super___uniq_ptr_impl<AnalyzerSettingInterfaceBool,_std::default_delete<AnalyzerSettingInterfaceBool>_>
  ._M_t.
  super__Tuple_impl<0UL,_AnalyzerSettingInterfaceBool_*,_std::default_delete<AnalyzerSettingInterfaceBool>_>
  .super__Head_base<0UL,_AnalyzerSettingInterfaceBool_*,_false>._M_head_impl = this_03;
  if (pAVar12 != (AnalyzerSettingInterfaceBool *)0x0) {
    (**(code **)(*(long *)pAVar12 + 8))();
    this_03 = (puVar8->_M_t).
              super___uniq_ptr_impl<AnalyzerSettingInterfaceBool,_std::default_delete<AnalyzerSettingInterfaceBool>_>
              ._M_t.
              super__Tuple_impl<0UL,_AnalyzerSettingInterfaceBool_*,_std::default_delete<AnalyzerSettingInterfaceBool>_>
              .super__Head_base<0UL,_AnalyzerSettingInterfaceBool_*,_false>._M_head_impl;
  }
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)this_03,"");
  AnalyzerSettingInterfaceBool::SetCheckBoxText
            ((char *)(puVar8->_M_t).
                     super___uniq_ptr_impl<AnalyzerSettingInterfaceBool,_std::default_delete<AnalyzerSettingInterfaceBool>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_AnalyzerSettingInterfaceBool_*,_std::default_delete<AnalyzerSettingInterfaceBool>_>
                     .super__Head_base<0UL,_AnalyzerSettingInterfaceBool_*,_false>._M_head_impl);
  uVar17 = (ulong)this->mUseAutobaud;
  AnalyzerSettingInterfaceBool::SetValue
            (SUB81((this->mUseAutobaudInterface)._M_t.
                   super___uniq_ptr_impl<AnalyzerSettingInterfaceBool,_std::default_delete<AnalyzerSettingInterfaceBool>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_AnalyzerSettingInterfaceBool_*,_std::default_delete<AnalyzerSettingInterfaceBool>_>
                   .super__Head_base<0UL,_AnalyzerSettingInterfaceBool_*,_false>._M_head_impl,0));
  pAVar14 = (AnalyzerSettingInterfaceNumberList *)
            AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,uVar17);
  AnalyzerSettingInterfaceNumberList::AnalyzerSettingInterfaceNumberList(pAVar14);
  pAVar13 = (puVar3->_M_t).
            super___uniq_ptr_impl<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
            ._M_t.
            super__Tuple_impl<0UL,_AnalyzerSettingInterfaceNumberList_*,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
            .super__Head_base<0UL,_AnalyzerSettingInterfaceNumberList_*,_false>._M_head_impl;
  (puVar3->_M_t).
  super___uniq_ptr_impl<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
  ._M_t.
  super__Tuple_impl<0UL,_AnalyzerSettingInterfaceNumberList_*,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
  .super__Head_base<0UL,_AnalyzerSettingInterfaceNumberList_*,_false>._M_head_impl = pAVar14;
  if (pAVar13 != (AnalyzerSettingInterfaceNumberList *)0x0) {
    (**(code **)(*(long *)pAVar13 + 8))();
    pAVar14 = (puVar3->_M_t).
              super___uniq_ptr_impl<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
              ._M_t.
              super__Tuple_impl<0UL,_AnalyzerSettingInterfaceNumberList_*,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
              .super__Head_base<0UL,_AnalyzerSettingInterfaceNumberList_*,_false>._M_head_impl;
  }
  pcVar18 = "Bits per Frame";
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)pAVar14,"Bits per Frame");
  for (lVar21 = 1; lVar21 != 0x41; lVar21 = lVar21 + 1) {
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    pcVar18 = "8 Bits per Transfer (Standard)";
    iVar20 = (int)lVar21;
    poVar15 = local_1a8;
    if (iVar20 != 8) {
      if (iVar20 == 1) {
        pcVar18 = "1 Bit per Transfer";
      }
      else {
        poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        pcVar18 = " Bits per Transfer";
      }
    }
    std::operator<<(poVar15,pcVar18);
    pAVar13 = (puVar3->_M_t).
              super___uniq_ptr_impl<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
              ._M_t.
              super__Tuple_impl<0UL,_AnalyzerSettingInterfaceNumberList_*,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
              .super__Head_base<0UL,_AnalyzerSettingInterfaceNumberList_*,_false>._M_head_impl;
    std::__cxx11::stringbuf::str();
    pcVar18 = local_1d8[0];
    AnalyzerSettingInterfaceNumberList::AddNumber((double)iVar20,(char *)pAVar13,local_1d8[0]);
    std::__cxx11::string::~string((string *)local_1d8);
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  }
  AnalyzerSettingInterfaceNumberList::SetNumber((double)this->mBitsPerTransfer);
  pAVar14 = (AnalyzerSettingInterfaceNumberList *)
            AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,(ulong)pcVar18);
  AnalyzerSettingInterfaceNumberList::AnalyzerSettingInterfaceNumberList(pAVar14);
  pAVar13 = (puVar5->_M_t).
            super___uniq_ptr_impl<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
            ._M_t.
            super__Tuple_impl<0UL,_AnalyzerSettingInterfaceNumberList_*,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
            .super__Head_base<0UL,_AnalyzerSettingInterfaceNumberList_*,_false>._M_head_impl;
  (puVar5->_M_t).
  super___uniq_ptr_impl<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
  ._M_t.
  super__Tuple_impl<0UL,_AnalyzerSettingInterfaceNumberList_*,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
  .super__Head_base<0UL,_AnalyzerSettingInterfaceNumberList_*,_false>._M_head_impl = pAVar14;
  if (pAVar13 != (AnalyzerSettingInterfaceNumberList *)0x0) {
    (**(code **)(*(long *)pAVar13 + 8))();
    pAVar14 = (puVar5->_M_t).
              super___uniq_ptr_impl<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
              ._M_t.
              super__Tuple_impl<0UL,_AnalyzerSettingInterfaceNumberList_*,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
              .super__Head_base<0UL,_AnalyzerSettingInterfaceNumberList_*,_false>._M_head_impl;
  }
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)pAVar14,"Stop Bits");
  AnalyzerSettingInterfaceNumberList::AddNumber
            (1.0,(char *)(puVar5->_M_t).
                         super___uniq_ptr_impl<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_AnalyzerSettingInterfaceNumberList_*,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
                         .super__Head_base<0UL,_AnalyzerSettingInterfaceNumberList_*,_false>.
                         _M_head_impl,"1 Stop Bit (Standard)");
  AnalyzerSettingInterfaceNumberList::AddNumber
            (1.5,(char *)(puVar5->_M_t).
                         super___uniq_ptr_impl<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_AnalyzerSettingInterfaceNumberList_*,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
                         .super__Head_base<0UL,_AnalyzerSettingInterfaceNumberList_*,_false>.
                         _M_head_impl,"1.5 Stop Bits");
  pcVar18 = "2 Stop Bits";
  AnalyzerSettingInterfaceNumberList::AddNumber
            (2.0,(char *)(puVar5->_M_t).
                         super___uniq_ptr_impl<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_AnalyzerSettingInterfaceNumberList_*,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
                         .super__Head_base<0UL,_AnalyzerSettingInterfaceNumberList_*,_false>.
                         _M_head_impl,"2 Stop Bits");
  AnalyzerSettingInterfaceNumberList::SetNumber(this->mStopBits);
  pAVar14 = (AnalyzerSettingInterfaceNumberList *)
            AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,(ulong)pcVar18);
  AnalyzerSettingInterfaceNumberList::AnalyzerSettingInterfaceNumberList(pAVar14);
  pAVar13 = (puVar6->_M_t).
            super___uniq_ptr_impl<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
            ._M_t.
            super__Tuple_impl<0UL,_AnalyzerSettingInterfaceNumberList_*,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
            .super__Head_base<0UL,_AnalyzerSettingInterfaceNumberList_*,_false>._M_head_impl;
  (puVar6->_M_t).
  super___uniq_ptr_impl<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
  ._M_t.
  super__Tuple_impl<0UL,_AnalyzerSettingInterfaceNumberList_*,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
  .super__Head_base<0UL,_AnalyzerSettingInterfaceNumberList_*,_false>._M_head_impl = pAVar14;
  if (pAVar13 != (AnalyzerSettingInterfaceNumberList *)0x0) {
    (**(code **)(*(long *)pAVar13 + 8))();
    pAVar14 = (puVar6->_M_t).
              super___uniq_ptr_impl<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
              ._M_t.
              super__Tuple_impl<0UL,_AnalyzerSettingInterfaceNumberList_*,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
              .super__Head_base<0UL,_AnalyzerSettingInterfaceNumberList_*,_false>._M_head_impl;
  }
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)pAVar14,"Parity Bit");
  AnalyzerSettingInterfaceNumberList::AddNumber
            (0.0,(char *)(puVar6->_M_t).
                         super___uniq_ptr_impl<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_AnalyzerSettingInterfaceNumberList_*,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
                         .super__Head_base<0UL,_AnalyzerSettingInterfaceNumberList_*,_false>.
                         _M_head_impl,"No Parity Bit (Standard)");
  AnalyzerSettingInterfaceNumberList::AddNumber
            (1.0,(char *)(puVar6->_M_t).
                         super___uniq_ptr_impl<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_AnalyzerSettingInterfaceNumberList_*,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
                         .super__Head_base<0UL,_AnalyzerSettingInterfaceNumberList_*,_false>.
                         _M_head_impl,"Even Parity Bit");
  pcVar18 = "Odd Parity Bit";
  AnalyzerSettingInterfaceNumberList::AddNumber
            (2.0,(char *)(puVar6->_M_t).
                         super___uniq_ptr_impl<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_AnalyzerSettingInterfaceNumberList_*,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
                         .super__Head_base<0UL,_AnalyzerSettingInterfaceNumberList_*,_false>.
                         _M_head_impl,"Odd Parity Bit");
  AnalyzerSettingInterfaceNumberList::SetNumber((double)this->mParity);
  pAVar14 = (AnalyzerSettingInterfaceNumberList *)
            AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,(ulong)pcVar18);
  AnalyzerSettingInterfaceNumberList::AnalyzerSettingInterfaceNumberList(pAVar14);
  pAVar13 = (puVar4->_M_t).
            super___uniq_ptr_impl<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
            ._M_t.
            super__Tuple_impl<0UL,_AnalyzerSettingInterfaceNumberList_*,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
            .super__Head_base<0UL,_AnalyzerSettingInterfaceNumberList_*,_false>._M_head_impl;
  (puVar4->_M_t).
  super___uniq_ptr_impl<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
  ._M_t.
  super__Tuple_impl<0UL,_AnalyzerSettingInterfaceNumberList_*,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
  .super__Head_base<0UL,_AnalyzerSettingInterfaceNumberList_*,_false>._M_head_impl = pAVar14;
  if (pAVar13 != (AnalyzerSettingInterfaceNumberList *)0x0) {
    (**(code **)(*(long *)pAVar13 + 8))();
    pAVar14 = (puVar4->_M_t).
              super___uniq_ptr_impl<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
              ._M_t.
              super__Tuple_impl<0UL,_AnalyzerSettingInterfaceNumberList_*,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
              .super__Head_base<0UL,_AnalyzerSettingInterfaceNumberList_*,_false>._M_head_impl;
  }
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)pAVar14,"Significant Bit");
  AnalyzerSettingInterfaceNumberList::AddNumber
            (1.0,(char *)(puVar4->_M_t).
                         super___uniq_ptr_impl<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_AnalyzerSettingInterfaceNumberList_*,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
                         .super__Head_base<0UL,_AnalyzerSettingInterfaceNumberList_*,_false>.
                         _M_head_impl,"Least Significant Bit Sent First (Standard)");
  pcVar18 = "Most Significant Bit Sent First";
  AnalyzerSettingInterfaceNumberList::AddNumber
            (0.0,(char *)(puVar4->_M_t).
                         super___uniq_ptr_impl<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_AnalyzerSettingInterfaceNumberList_*,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
                         .super__Head_base<0UL,_AnalyzerSettingInterfaceNumberList_*,_false>.
                         _M_head_impl,"Most Significant Bit Sent First");
  AnalyzerSettingInterfaceNumberList::SetNumber((double)this->mShiftOrder);
  pAVar14 = (AnalyzerSettingInterfaceNumberList *)
            AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,(ulong)pcVar18);
  AnalyzerSettingInterfaceNumberList::AnalyzerSettingInterfaceNumberList(pAVar14);
  pAVar13 = (puVar7->_M_t).
            super___uniq_ptr_impl<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
            ._M_t.
            super__Tuple_impl<0UL,_AnalyzerSettingInterfaceNumberList_*,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
            .super__Head_base<0UL,_AnalyzerSettingInterfaceNumberList_*,_false>._M_head_impl;
  (puVar7->_M_t).
  super___uniq_ptr_impl<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
  ._M_t.
  super__Tuple_impl<0UL,_AnalyzerSettingInterfaceNumberList_*,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
  .super__Head_base<0UL,_AnalyzerSettingInterfaceNumberList_*,_false>._M_head_impl = pAVar14;
  if (pAVar13 != (AnalyzerSettingInterfaceNumberList *)0x0) {
    (**(code **)(*(long *)pAVar13 + 8))();
    pAVar14 = (puVar7->_M_t).
              super___uniq_ptr_impl<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
              ._M_t.
              super__Tuple_impl<0UL,_AnalyzerSettingInterfaceNumberList_*,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
              .super__Head_base<0UL,_AnalyzerSettingInterfaceNumberList_*,_false>._M_head_impl;
  }
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)pAVar14,"Signal inversion");
  AnalyzerSettingInterfaceNumberList::AddNumber
            (0.0,(char *)(puVar7->_M_t).
                         super___uniq_ptr_impl<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_AnalyzerSettingInterfaceNumberList_*,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
                         .super__Head_base<0UL,_AnalyzerSettingInterfaceNumberList_*,_false>.
                         _M_head_impl,"Non Inverted (Standard)");
  pcVar18 = "Inverted";
  AnalyzerSettingInterfaceNumberList::AddNumber
            (1.0,(char *)(puVar7->_M_t).
                         super___uniq_ptr_impl<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_AnalyzerSettingInterfaceNumberList_*,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
                         .super__Head_base<0UL,_AnalyzerSettingInterfaceNumberList_*,_false>.
                         _M_head_impl,"Inverted");
  AnalyzerSettingInterfaceNumberList::SetNumber((double)(int)this->mInverted);
  pAVar14 = (AnalyzerSettingInterfaceNumberList *)
            AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,(ulong)pcVar18);
  AnalyzerSettingInterfaceNumberList::AnalyzerSettingInterfaceNumberList(pAVar14);
  pAVar13 = (puVar9->_M_t).
            super___uniq_ptr_impl<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
            ._M_t.
            super__Tuple_impl<0UL,_AnalyzerSettingInterfaceNumberList_*,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
            .super__Head_base<0UL,_AnalyzerSettingInterfaceNumberList_*,_false>._M_head_impl;
  (puVar9->_M_t).
  super___uniq_ptr_impl<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
  ._M_t.
  super__Tuple_impl<0UL,_AnalyzerSettingInterfaceNumberList_*,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
  .super__Head_base<0UL,_AnalyzerSettingInterfaceNumberList_*,_false>._M_head_impl = pAVar14;
  if (pAVar13 != (AnalyzerSettingInterfaceNumberList *)0x0) {
    (**(code **)(*(long *)pAVar13 + 8))();
    pAVar14 = (puVar9->_M_t).
              super___uniq_ptr_impl<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
              ._M_t.
              super__Tuple_impl<0UL,_AnalyzerSettingInterfaceNumberList_*,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
              .super__Head_base<0UL,_AnalyzerSettingInterfaceNumberList_*,_false>._M_head_impl;
  }
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)pAVar14,"Mode");
  AnalyzerSettingInterfaceNumberList::AddNumber
            (0.0,(char *)(puVar9->_M_t).
                         super___uniq_ptr_impl<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_AnalyzerSettingInterfaceNumberList_*,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
                         .super__Head_base<0UL,_AnalyzerSettingInterfaceNumberList_*,_false>.
                         _M_head_impl,"Normal");
  AnalyzerSettingInterfaceNumberList::AddNumber
            (1.0,(char *)(puVar9->_M_t).
                         super___uniq_ptr_impl<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_AnalyzerSettingInterfaceNumberList_*,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
                         .super__Head_base<0UL,_AnalyzerSettingInterfaceNumberList_*,_false>.
                         _M_head_impl,"MP - Address indicated by MSB=0");
  AnalyzerSettingInterfaceNumberList::AddNumber
            (2.0,(char *)(puVar9->_M_t).
                         super___uniq_ptr_impl<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_AnalyzerSettingInterfaceNumberList_*,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
                         .super__Head_base<0UL,_AnalyzerSettingInterfaceNumberList_*,_false>.
                         _M_head_impl,"MDB - Address indicated by MSB=1 (TX only)");
  AnalyzerSettingInterfaceNumberList::SetNumber((double)this->mSerialMode);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  uVar19 = (uint)this;
  AnalyzerSettings::AddExportOption(uVar19,(char *)0x0);
  AnalyzerSettings::AddExportExtension(uVar19,(char *)0x0,"text");
  AnalyzerSettings::AddExportExtension(uVar19,(char *)0x0,"csv");
  AnalyzerSettings::ClearChannels();
  AnalyzerSettings::AddChannel((Channel *)this,(char *)this_00,true);
  return;
}

Assistant:

SerialAnalyzerSettings::SerialAnalyzerSettings()
    : mInputChannel( UNDEFINED_CHANNEL ),
      mBitRate( 9600 ),
      mBitsPerTransfer( 8 ),
      mStopBits( 1.0 ),
      mParity( AnalyzerEnums::None ),
      mShiftOrder( AnalyzerEnums::LsbFirst ),
      mInverted( false ),
      mUseAutobaud( false ),
      mSerialMode( SerialAnalyzerEnums::Normal )
{
    mInputChannelInterface.reset( new AnalyzerSettingInterfaceChannel() );
    mInputChannelInterface->SetTitleAndTooltip( "Input Channel", "Standard Async Serial" );
    mInputChannelInterface->SetChannel( mInputChannel );

    mBitRateInterface.reset( new AnalyzerSettingInterfaceInteger() );
    mBitRateInterface->SetTitleAndTooltip( "Bit Rate (Bits/s)", "Specify the bit rate in bits per second." );
    mBitRateInterface->SetMax( 100000000 );
    mBitRateInterface->SetMin( 1 );
    mBitRateInterface->SetInteger( static_cast<int>( mBitRate ) );

    mUseAutobaudInterface.reset( new AnalyzerSettingInterfaceBool() );
    mUseAutobaudInterface->SetTitleAndTooltip(
        "", "With Autobaud turned on, the analyzer will run as usual, with the current bit rate.  At the same time, it will also keep "
            "track of the shortest pulse it detects. \nAfter analyzing all the data, if the bit rate implied by this shortest pulse is "
            "different by more than 10% from the specified bit rate, the bit rate will be changed and the analysis run again." );
    mUseAutobaudInterface->SetCheckBoxText( "Use Autobaud" );
    mUseAutobaudInterface->SetValue( mUseAutobaud );

    mBitsPerTransferInterface.reset( new AnalyzerSettingInterfaceNumberList() );
    mBitsPerTransferInterface->SetTitleAndTooltip( "Bits per Frame", "Select the number of bits per frame" );
    for( U32 i = 1; i <= 64; i++ )
    {
        std::stringstream ss;

        if( i == 1 )
            ss << "1 Bit per Transfer";
        else if( i == 8 )
            ss << "8 Bits per Transfer (Standard)";
        else
            ss << i << " Bits per Transfer";

        mBitsPerTransferInterface->AddNumber( i, ss.str().c_str(), "" );
    }
    mBitsPerTransferInterface->SetNumber( mBitsPerTransfer );


    mStopBitsInterface.reset( new AnalyzerSettingInterfaceNumberList() );
    mStopBitsInterface->SetTitleAndTooltip( "Stop Bits", "Specify the number of stop bits." );
    mStopBitsInterface->AddNumber( 1.0, "1 Stop Bit (Standard)", "" );
    mStopBitsInterface->AddNumber( 1.5, "1.5 Stop Bits", "" );
    mStopBitsInterface->AddNumber( 2.0, "2 Stop Bits", "" );
    mStopBitsInterface->SetNumber( mStopBits );


    mParityInterface.reset( new AnalyzerSettingInterfaceNumberList() );
    mParityInterface->SetTitleAndTooltip( "Parity Bit", "Specify None, Even, or Odd Parity." );
    mParityInterface->AddNumber( AnalyzerEnums::None, "No Parity Bit (Standard)", "" );
    mParityInterface->AddNumber( AnalyzerEnums::Even, "Even Parity Bit", "" );
    mParityInterface->AddNumber( AnalyzerEnums::Odd, "Odd Parity Bit", "" );
    mParityInterface->SetNumber( mParity );


    mShiftOrderInterface.reset( new AnalyzerSettingInterfaceNumberList() );
    mShiftOrderInterface->SetTitleAndTooltip( "Significant Bit",
                                              "Select if the most significant bit or least significant bit is transmitted first" );
    mShiftOrderInterface->AddNumber( AnalyzerEnums::LsbFirst, "Least Significant Bit Sent First (Standard)", "" );
    mShiftOrderInterface->AddNumber( AnalyzerEnums::MsbFirst, "Most Significant Bit Sent First", "" );
    mShiftOrderInterface->SetNumber( mShiftOrder );


    mInvertedInterface.reset( new AnalyzerSettingInterfaceNumberList() );
    mInvertedInterface->SetTitleAndTooltip( "Signal inversion", "Specify if the serial signal is inverted" );
    mInvertedInterface->AddNumber( false, "Non Inverted (Standard)", "" );
    mInvertedInterface->AddNumber( true, "Inverted", "" );

    mInvertedInterface->SetNumber( mInverted );
    enum Mode
    {
        Normal,
        MpModeRightZeroMeansAddress,
        MpModeRightOneMeansAddress,
        MpModeLeftZeroMeansAddress,
        MpModeLeftOneMeansAddress
    };

    mSerialModeInterface.reset( new AnalyzerSettingInterfaceNumberList() );
    mSerialModeInterface->SetTitleAndTooltip( "Mode", "" );
    mSerialModeInterface->AddNumber( SerialAnalyzerEnums::Normal, "Normal", "" );
    mSerialModeInterface->AddNumber( SerialAnalyzerEnums::MpModeMsbZeroMeansAddress, "MP - Address indicated by MSB=0",
                                     "Multi-processor, 9-bit serial" );
    mSerialModeInterface->AddNumber( SerialAnalyzerEnums::MpModeMsbOneMeansAddress, "MDB - Address indicated by MSB=1 (TX only)",
                                     "Multi-drop, 9-bit serial" );
    mSerialModeInterface->SetNumber( mSerialMode );

    AddInterface( mInputChannelInterface.get() );
    AddInterface( mBitRateInterface.get() );
    AddInterface( mBitsPerTransferInterface.get() );
    AddInterface( mStopBitsInterface.get() );
    AddInterface( mParityInterface.get() );
    AddInterface( mShiftOrderInterface.get() );
    AddInterface( mInvertedInterface.get() );
    AddInterface( mSerialModeInterface.get() );

    // AddExportOption( 0, "Export as text/csv file", "text (*.txt);;csv (*.csv)" );
    AddExportOption( 0, "Export as text/csv file" );
    AddExportExtension( 0, "text", "txt" );
    AddExportExtension( 0, "csv", "csv" );

    ClearChannels();
    AddChannel( mInputChannel, "Serial", false );
}